

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall
SeedTree::SeedTree(SeedTree *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
                  size_t num_leaves,limbo_salt_t *salt,size_t rep_idx)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  int iVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *seed_00;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  size_type sVar7;
  SeedTree *this_01;
  size_t idx;
  SeedTree *idx_00;
  long lVar8;
  long lVar9;
  reference rVar10;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  _Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_50;
  
  this_00 = &this->_node_exists;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_num_leaves = num_leaves;
  uVar4 = (int)num_leaves - 1;
  if (uVar4 == 0) {
    bVar3 = 0;
  }
  else {
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bVar3 = (byte)iVar1 ^ 0x1f;
  }
  bVar3 = 0x20 - bVar3;
  if ((int)num_leaves == 0) {
    bVar3 = 0;
  }
  sVar7 = ((long)(2 << (bVar3 & 0x1f)) + (num_leaves - (long)(1 << (bVar3 & 0x1f)))) - 1;
  this->_num_total_nodes = sVar7;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,sVar7,false);
  sVar6 = this->_num_total_nodes;
  for (uVar5 = sVar6 - num_leaves; uVar5 < sVar6; uVar5 = uVar5 + 1) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar5);
    *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    sVar6 = this->_num_total_nodes;
  }
  idx = sVar6 * 2 + num_leaves * -2 + 1;
  sVar7 = sVar6 - num_leaves;
  do {
    if (sVar7 == 0) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
      *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
      std::
      vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::resize(&this->_data,this->_num_total_nodes);
      std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
      _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>> *
                 )&local_80,seed);
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(this->_data).
                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                     (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_80);
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_80);
      uVar5 = this->_num_total_nodes;
      lVar8 = 0x20;
      sVar6 = 1;
      lVar9 = 0;
      for (idx_00 = (SeedTree *)0x0; idx_00 <= (SeedTree *)((uVar5 >> 1) - 1);
          idx_00 = (SeedTree *)
                   ((long)&(idx_00->_data).
                           super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
        this_01 = idx_00;
        bVar2 = node_exists(this,(size_t)idx_00);
        if (bVar2) {
          seed_00 = std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                    value((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                          ((long)&(((this->_data).
                                    super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                  )._M_payload + lVar9));
          expandSeed(&local_80,this_01,seed_00,salt,rep_idx,(size_t)idx_00);
          bVar2 = node_exists(this,sVar6);
          if (bVar2) {
            std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
            _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_50,&local_80);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(((this->_data).
                                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        )._M_payload + lVar8),&local_50);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_reset(&local_50);
          }
          bVar2 = node_exists(this,sVar6 + 1);
          if (bVar2) {
            std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
            _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_50,&local_80.second);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(this->_data).
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload + lVar8),&local_50);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_reset(&local_50);
          }
          std::
          pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~pair(&local_80);
        }
        lVar9 = lVar9 + 0x20;
        lVar8 = lVar8 + 0x40;
        sVar6 = sVar6 + 2;
      }
      return;
    }
    bVar2 = node_exists(this,idx);
    if (bVar2) {
LAB_0011030f:
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar7);
      *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    }
    else {
      bVar2 = node_exists(this,idx + 1);
      if (bVar2) goto LAB_0011030f;
    }
    idx = idx - 2;
    sVar7 = sVar7 - 1;
  } while( true );
}

Assistant:

SeedTree::SeedTree(std::vector<uint8_t> seed, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  // push back root seed
  _data.resize(_num_total_nodes);
  _data[0] = std::optional(seed);

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i))
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}